

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

Regexp * __thiscall
re2::Regexp::Walker<re2::Regexp_*>::WalkInternal
          (Walker<re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  *this_00;
  ushort uVar1;
  uint uVar2;
  Regexp *pRVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Regexp **ppRVar8;
  _Elt_pointer pWVar9;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar10;
  Regexp *unaff_RBP;
  bool stop;
  Regexp *local_1b8;
  anon_union_8_2_3df47e5c_for_Regexp_7 local_1b0;
  anon_union_8_2_3df47e5c_for_Regexp_7 local_1a8;
  Regexp *local_1a0;
  undefined8 local_188;
  Regexp *pRVar7;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/walker-inl.h"
               ,0xa3);
    std::operator<<((ostream *)&local_1a8,"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  this_00 = &this->stack_;
  local_1a8._0_4_ = 0xffffffff;
  local_188 = 0;
  local_1b0.subone_ = re;
  local_1a0 = top_arg;
  std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>::
  emplace_back<re2::WalkState<re2::Regexp*>>
            ((deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>> *)
             this_00,(WalkState<re2::Regexp_*> *)&local_1b0);
  do {
    pWVar9 = (this->stack_).c.
             super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar9 == (this->stack_).c.
                  super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pWVar9 = (this->stack_).c.
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    pRVar3 = pWVar9[-1].re;
    pRVar7 = unaff_RBP;
    if (pWVar9[-1].n == -1) {
      iVar5 = this->max_visits_;
      this->max_visits_ = iVar5 + -1;
      if (iVar5 < 1) {
        this->stopped_early_ = true;
        iVar5 = (*this->_vptr_Walker[5])(this,pRVar3,pWVar9[-1].parent_arg);
        pRVar7 = (Regexp *)CONCAT44(extraout_var_01,iVar5);
      }
      else {
        local_1b0.submany_ = local_1b0.submany_ & 0xffffffffffffff00;
        iVar5 = (*this->_vptr_Walker[2])(this,pRVar3,pWVar9[-1].parent_arg,&local_1b0);
        pWVar9[-1].pre_arg = (Regexp *)CONCAT44(extraout_var,iVar5);
        uVar4 = local_1b0._0_1_;
        pRVar7 = (Regexp *)CONCAT44(extraout_var,iVar5);
        if (local_1b0._0_1_ == '\0') {
          pWVar9[-1].n = 0;
          pWVar9[-1].child_args = (Regexp **)0x0;
          uVar1 = pRVar3->nsub_;
          pRVar7 = unaff_RBP;
          if (uVar1 != 0) {
            if (uVar1 == 1) {
              ppRVar8 = &pWVar9[-1].child_arg;
            }
            else {
              ppRVar8 = (Regexp **)operator_new__((ulong)uVar1 << 3);
            }
            pWVar9[-1].child_args = ppRVar8;
          }
        }
        if (uVar4 == '\0') goto LAB_0023f1ac;
      }
LAB_0023f33d:
      std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>::
      pop_back(&this_00->c);
      pWVar9 = (this->stack_).c.
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar9 == (this->stack_).c.
                    super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        iVar5 = 1;
        local_1b8 = pRVar7;
      }
      else {
        if (pWVar9 == (this->stack_).c.
                      super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pWVar9 = (this->stack_).c.
                   super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        if (pWVar9[-1].child_args == (Regexp **)0x0) {
          ppRVar8 = &pWVar9[-1].child_arg;
        }
        else {
          ppRVar8 = pWVar9[-1].child_args + pWVar9[-1].n;
        }
        *ppRVar8 = pRVar7;
        pWVar9[-1].n = pWVar9[-1].n + 1;
        iVar5 = 0;
      }
    }
    else {
LAB_0023f1ac:
      uVar1 = pRVar3->nsub_;
      if (uVar1 == 0) {
LAB_0023f2a8:
        iVar5 = (*this->_vptr_Walker[3])
                          (this,pRVar3,pWVar9[-1].parent_arg,pWVar9[-1].pre_arg,
                           pWVar9[-1].child_args,(ulong)(uint)pWVar9[-1].n);
        pRVar7 = (Regexp *)CONCAT44(extraout_var_00,iVar5);
        if ((1 < pRVar3->nsub_) && (pWVar9[-1].child_args != (Regexp **)0x0)) {
          operator_delete__(pWVar9[-1].child_args);
        }
        goto LAB_0023f33d;
      }
      if (uVar1 == 1) {
        paVar10 = &pRVar3->field_5;
      }
      else {
        paVar10 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
      }
      uVar2 = pWVar9[-1].n;
      iVar5 = 0;
      if ((int)uVar2 < (int)(uint)uVar1) {
        if (((int)uVar2 < 1 || !use_copy) ||
           ((Regexp *)paVar10[uVar2 - 1].submany_ != (Regexp *)paVar10[uVar2].submany_)) {
          local_1b0 = paVar10[pWVar9[-1].n];
          local_1a0 = pWVar9[-1].pre_arg;
          local_1a8._0_4_ = 0xffffffff;
          local_188 = 0;
          std::deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>::
          emplace_back<re2::WalkState<re2::Regexp*>>
                    ((deque<re2::WalkState<re2::Regexp*>,std::allocator<re2::WalkState<re2::Regexp*>>>
                      *)this_00,(WalkState<re2::Regexp_*> *)&local_1b0);
        }
        else {
          iVar6 = (*this->_vptr_Walker[4])(this,pWVar9[-1].child_args[uVar2 - 1]);
          iVar5 = pWVar9[-1].n;
          pWVar9[-1].child_args[iVar5] = (Regexp *)CONCAT44(extraout_var_02,iVar6);
          pWVar9[-1].n = iVar5 + 1;
        }
        iVar5 = 3;
      }
      if ((int)(uint)uVar1 <= (int)uVar2) goto LAB_0023f2a8;
    }
    unaff_RBP = pRVar7;
    if ((iVar5 != 0) && (iVar5 != 3)) {
      return local_1b8;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}